

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O1

void __thiscall duckdb_skiplistlib::skip_list::Exception::~Exception(Exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_024b4f70;
  pcVar1 = (this->msg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~Exception() noexcept {}